

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O2

uint64_t to_msr_pl_default(double watts,double power_units)

{
  uint __line;
  uint64_t uVar1;
  ulong uVar2;
  char *__assertion;
  
  if (watts < 0.0) {
    __assertion = "watts >= 0";
    __line = 0x5b;
  }
  else {
    if (0.0 < power_units) {
      uVar2 = (ulong)(watts / power_units);
      uVar1 = (long)(watts / power_units - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
      if (0x7fff < uVar1) {
        fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
        fprintf(_stderr,"Power limit too large: %.12f W, using max: %.12f W\n",watts,
                power_units * 32767.0);
        uVar1 = 0x7fff;
      }
      return uVar1;
    }
    __assertion = "power_units > 0";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,__line,"uint64_t to_msr_pl_default(double, double)");
}

Assistant:

static uint64_t to_msr_pl_default(double watts, double power_units) {
  assert(watts >= 0);
  assert(power_units > 0);
  // Lower bound is 0, but upper bound is limited by what fits in 15 bits
  static const uint64_t MSR_POWER_MAX = 0x7FFF;
  uint64_t bits = (uint64_t) (watts / power_units);
  if (bits > MSR_POWER_MAX) {
    raplcap_log(WARN, "Power limit too large: %.12f W, using max: %.12f W\n", watts, MSR_POWER_MAX * power_units);
    bits = MSR_POWER_MAX;
  }
  raplcap_log(DEBUG, "to_msr_pl_default: watts=%.12f, power_units=%.12f, bits=0x%04lX\n", watts, power_units, bits);
  return bits;
}